

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

error_code __thiscall simdjson::dom::parser::allocate(parser *this,size_t capacity,size_t max_depth)

{
  bool bVar1;
  pointer this_00;
  implementation *piVar2;
  error_code local_2c;
  error_code err;
  size_t max_depth_local;
  size_t capacity_local;
  parser *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->implementation);
  if (bVar1) {
    this_00 = std::
              unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
              ::operator->(&this->implementation);
    local_2c = internal::dom_parser_implementation::allocate(this_00,capacity,max_depth);
  }
  else {
    piVar2 = internal::atomic_ptr<const_simdjson::implementation>::operator->
                       ((atomic_ptr<const_simdjson::implementation> *)&active_implementation);
    local_2c = (*piVar2->_vptr_implementation[3])(piVar2,capacity,max_depth,&this->implementation);
  }
  if (local_2c == SUCCESS) {
    this_local._4_4_ = SUCCESS;
  }
  else {
    this_local._4_4_ = local_2c;
  }
  return this_local._4_4_;
}

Assistant:

simdjson_warn_unused
inline error_code parser::allocate(size_t capacity, size_t max_depth) noexcept {
  //
  // Reallocate implementation if needed
  //
  error_code err;
  if (implementation) {
    err = implementation->allocate(capacity, max_depth);
  } else {
    err = simdjson::active_implementation->create_dom_parser_implementation(capacity, max_depth, implementation);
  }
  if (err) { return err; }
  return SUCCESS;
}